

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.cc
# Opt level: O0

void __thiscall lf::base::AutoTimer::~AutoTimer(AutoTimer *this)

{
  bool bVar1;
  AutoTimer *this_local;
  
  bVar1 = Timer::IsStopped(&this->timer_);
  if (!bVar1) {
    Timer::Stop(&this->timer_);
    Report(this);
  }
  std::
  variant<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::pair<std::shared_ptr<spdlog::logger>,_spdlog::level::level_enum>_>
  ::~variant(&this->output_);
  std::__cxx11::string::~string((string *)&this->format_);
  return;
}

Assistant:

AutoTimer::~AutoTimer() {
  if (!timer_.IsStopped()) {
    timer_.Stop();
    try {
      Report();

      // NOLINTNEXTLINE(bugprone-empty-catch)
    } catch (...) {  // eat any exceptions
    }
  }
}